

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CSubNet::Match(CSubNet *this,CNetAddr *addr)

{
  uint8_t *puVar1;
  Network NVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  CSubNet *pCVar8;
  uint uVar9;
  long lVar10;
  size_t x;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->valid == true) && (bVar7 = CNetAddr::IsValid(addr), bVar7)) &&
     (NVar2 = (this->network).m_net, NVar2 == addr->m_net)) {
    if (NVar2 - NET_ONION < 4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
        bVar7 = ::operator==(addr,&this->network);
        return bVar7;
      }
      goto LAB_00585391;
    }
    bVar7 = false;
    if ((NVar2 != NET_UNROUTABLE) && (NVar2 != NET_MAX)) {
      uVar3 = (this->network).m_addr._size;
      uVar6 = uVar3 - 0x11;
      if (uVar3 < 0x11) {
        uVar6 = uVar3;
      }
      uVar4 = (addr->m_addr)._size;
      uVar9 = uVar4 - 0x11;
      if (uVar4 < 0x11) {
        uVar9 = uVar4;
      }
      if (uVar6 != uVar9) {
        __assert_fail("network.m_addr.size() == addr.m_addr.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                      ,0x410,"bool CSubNet::Match(const CNetAddr &) const");
      }
      if (0x10 < uVar4) {
        addr = (CNetAddr *)(addr->m_addr)._union.indirect_contents.indirect;
      }
      pCVar8 = this;
      if (0x10 < uVar3) {
        pCVar8 = (CSubNet *)(this->network).m_addr._union.indirect_contents.indirect;
      }
      lVar10 = 0;
      uVar11 = 0;
      do {
        bVar7 = uVar6 == uVar11;
        if (bVar7) break;
        lVar12 = lVar10 >> 0x20;
        puVar1 = this->netmask + uVar11;
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x100000000;
      } while ((*puVar1 & (addr->m_addr)._union.direct[lVar12]) == pCVar8->netmask[lVar12 + -0x20]);
    }
  }
  else {
    bVar7 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return bVar7;
  }
LAB_00585391:
  __stack_chk_fail();
}

Assistant:

bool CSubNet::Match(const CNetAddr &addr) const
{
    if (!valid || !addr.IsValid() || network.m_net != addr.m_net)
        return false;

    switch (network.m_net) {
    case NET_IPV4:
    case NET_IPV6:
        break;
    case NET_ONION:
    case NET_I2P:
    case NET_CJDNS:
    case NET_INTERNAL:
        return addr == network;
    case NET_UNROUTABLE:
    case NET_MAX:
        return false;
    }

    assert(network.m_addr.size() == addr.m_addr.size());
    for (size_t x = 0; x < addr.m_addr.size(); ++x) {
        if ((addr.m_addr[x] & netmask[x]) != network.m_addr[x]) {
            return false;
        }
    }
    return true;
}